

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

void __thiscall
MarkdownHighlighter::setHeadingStyles
          (MarkdownHighlighter *this,HighlighterState rule,QRegularExpressionMatch *match,
          int capturedGroup)

{
  int iVar1;
  QTextCharFormat *pQVar2;
  ulong uVar3;
  qreal size;
  HighlighterState local_44;
  undefined1 local_40 [8];
  QTextCharFormat linkFmt;
  QTextCharFormat *f;
  HighlighterState state;
  int capturedGroup_local;
  QRegularExpressionMatch *match_local;
  MarkdownHighlighter *pMStack_10;
  HighlighterState rule_local;
  MarkdownHighlighter *this_local;
  
  f._4_4_ = capturedGroup;
  _state = match;
  match_local._4_4_ = rule;
  pMStack_10 = this;
  f._0_4_ = QSyntaxHighlighter::currentBlockState();
  linkFmt._8_8_ =
       QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                 (&_formats,(HighlighterState *)&f);
  if (match_local._4_4_ == Link) {
    local_44 = Link;
    pQVar2 = QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                       (&_formats,&local_44);
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_40,pQVar2);
    size = QTextCharFormat::fontPointSize((QTextCharFormat *)linkFmt._8_8_);
    QTextCharFormat::setFontPointSize((QTextCharFormat *)local_40,size);
    if (f._4_4_ == 1) {
      iVar1 = QRegularExpressionMatch::capturedStart((int)_state);
      uVar3 = QRegularExpressionMatch::capturedLength((int)_state);
      QSyntaxHighlighter::setFormat((int)this,iVar1,(QTextCharFormat *)(uVar3 & 0xffffffff));
    }
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)local_40);
  }
  return;
}

Assistant:

void MarkdownHighlighter::setHeadingStyles(HighlighterState rule,
                                           const QRegularExpressionMatch &match,
                                           const int capturedGroup) {
    auto state = static_cast<HighlighterState>(currentBlockState());
    const QTextCharFormat &f = _formats[state];

    if (rule == HighlighterState::Link) {
        auto linkFmt = _formats[Link];
        linkFmt.setFontPointSize(f.fontPointSize());
        if (capturedGroup == 1) {
            setFormat(match.capturedStart(capturedGroup),
                      match.capturedLength(capturedGroup), linkFmt);
        }
        return;
    }
}